

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLattice.cpp
# Opt level: O2

void __thiscall OpenMD::shapedLattice::setGridDimension(shapedLattice *this,Vector3d *dimension)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dStack_20;
  
  Vector<double,_3U>::operator=
            (&(this->dimension_).super_Vector<double,_3U>,&dimension->super_Vector<double,_3U>);
  auVar4._0_8_ = (this->dimension_).super_Vector<double,_3U>.data_[0] * 0.5;
  auVar4._8_8_ = (this->dimension_).super_Vector<double,_3U>.data_[1] * 0.5;
  dVar1 = this->latticeConstant_;
  auVar5._8_4_ = SUB84(dVar1,0);
  auVar5._0_8_ = dVar1;
  auVar5._12_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar5 = divpd(auVar4,auVar5);
  dVar2 = ceil(auVar5._0_8_);
  dStack_20 = auVar5._8_8_;
  dVar3 = ceil(dStack_20);
  this->beginNx_ = -(int)dVar2;
  this->beginNy_ = -(int)dVar3;
  dVar1 = ceil(((this->dimension_).super_Vector<double,_3U>.data_[2] * 0.5) / dVar1);
  this->beginNz_ = -(int)dVar1;
  this->endNx_ = (int)dVar2;
  this->endNy_ = (int)dVar3;
  this->endNz_ = (int)dVar1;
  this->sitesComputed_ = false;
  return;
}

Assistant:

void shapedLattice::setGridDimension(Vector3d dimension) {
    dimension_ = dimension;
    // Find	number of unit cells in each direction
    beginNx_       = -(int)ceil(0.5 * dimension_[0] / latticeConstant_);
    beginNy_       = -(int)ceil(0.5 * dimension_[1] / latticeConstant_);
    beginNz_       = -(int)ceil(0.5 * dimension_[2] / latticeConstant_);
    endNx_         = (int)ceil(0.5 * dimension_[0] / latticeConstant_);
    endNy_         = (int)ceil(0.5 * dimension_[1] / latticeConstant_);
    endNz_         = (int)ceil(0.5 * dimension_[2] / latticeConstant_);
    sitesComputed_ = false;
  }